

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  uv_fs_t *puVar3;
  uv_fs_event_t *puVar4;
  uv_timer_t *loop_00;
  uv_fs_event_t *puVar5;
  uv_fs_t uStack_1e0;
  uv_loop_t *puStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x14e09e;
  loop = uv_default_loop();
  pcStack_20 = (code *)0x14e0b0;
  remove("watch_dir/file2");
  pcStack_20 = (code *)0x14e0bf;
  remove("watch_dir/file1");
  pcStack_20 = (code *)0x14e0cb;
  remove("watch_dir/");
  pcStack_20 = (code *)0x14e0d7;
  create_dir("watch_dir");
  pcStack_20 = (code *)0x14e0df;
  create_file("watch_dir/file1");
  pcStack_20 = (code *)0x14e0e7;
  create_file("watch_dir/file2");
  pcStack_20 = (code *)0x14e0f6;
  loop_00 = (uv_timer_t *)loop;
  iVar1 = uv_fs_event_init(loop,&fs_event);
  if (iVar1 == 0) {
    puVar4 = &fs_event;
    pcStack_20 = (code *)0x14e11a;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    loop_00 = (uv_timer_t *)puVar4;
    if (iVar1 != 0) goto LAB_0014e1f0;
    pcStack_20 = (code *)0x14e131;
    loop_00 = (uv_timer_t *)loop;
    iVar1 = uv_timer_init(loop,&timer);
    if (iVar1 != 0) goto LAB_0014e1f5;
    loop_00 = &timer;
    pcStack_20 = (code *)0x14e156;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_0014e1fa;
    pcStack_20 = (code *)0x14e168;
    loop_00 = (uv_timer_t *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 1) goto LAB_0014e1ff;
    if (timer_cb_called != 2) goto LAB_0014e204;
    if (close_cb_called != 2) goto LAB_0014e209;
    pcStack_20 = (code *)0x14e197;
    remove("watch_dir/file2");
    pcStack_20 = (code *)0x14e1a3;
    remove("watch_dir/file1");
    pcStack_20 = (code *)0x14e1af;
    remove("watch_dir/");
    pcStack_20 = (code *)0x14e1b4;
    loop = uv_default_loop();
    pcStack_20 = (code *)0x14e1c8;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_20 = (code *)0x14e1d2;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_20 = (code *)0x14e1d7;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x14e1df;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x14e1f0;
    run_test_fs_event_watch_file_cold_1();
LAB_0014e1f0:
    pcStack_20 = (code *)0x14e1f5;
    run_test_fs_event_watch_file_cold_2();
LAB_0014e1f5:
    pcStack_20 = (code *)0x14e1fa;
    run_test_fs_event_watch_file_cold_3();
LAB_0014e1fa:
    pcStack_20 = (code *)0x14e1ff;
    run_test_fs_event_watch_file_cold_4();
LAB_0014e1ff:
    pcStack_20 = (code *)0x14e204;
    run_test_fs_event_watch_file_cold_5();
LAB_0014e204:
    pcStack_20 = (code *)0x14e209;
    run_test_fs_event_watch_file_cold_6();
LAB_0014e209:
    pcStack_20 = (code *)0x14e20e;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_20 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_20 = (code *)0x192f1e;
  puVar4 = (uv_fs_event_t *)&uStack_1e0;
  puVar3 = &uStack_1e0;
  puVar5 = (uv_fs_event_t *)0x0;
  iVar2 = 0x41;
  puStack_28 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1e0,(char *)loop_00,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup(&uStack_1e0);
    puVar5 = (uv_fs_event_t *)0x0;
    iVar2 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_1e0,iVar1,(uv_fs_cb)0x0);
    puVar4 = (uv_fs_event_t *)puVar3;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&uStack_1e0);
      return extraout_EAX;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar5 == &fs_event) {
    if (iVar2 != 0) goto LAB_0014e2d3;
    if (extraout_EDX != 2) goto LAB_0014e2d8;
    iVar1 = strcmp((char *)puVar4,"file2");
    if (iVar1 == 0) {
      puVar4 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_0014e2e2;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0014e2d3:
    fs_event_cb_file_cold_2();
LAB_0014e2d8:
    puVar4 = puVar5;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_0014e2e2:
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close((uv_handle_t *)puVar4,close_cb);
    return extraout_EAX_01;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == 1);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}